

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O0

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
google::protobuf::compiler::cpp::anon_unknown_4::Vars
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,FieldDescriptor *field,Options *opts)

{
  initializer_list<google::protobuf::io::Printer::Sub> __l;
  Type TVar1;
  Descriptor *this;
  FieldDescriptor *field_00;
  AlphaNum *b;
  Options *in_RCX;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  FieldDescriptor *field_04;
  AlphaNum *in_R8;
  string_view sVar2;
  Sub *local_e88;
  char (*local_e78) [5];
  allocator<google::protobuf::io::Printer::Sub> local_d73;
  undefined1 local_d72;
  allocator<char> local_d71;
  string local_d70;
  allocator<char> local_d49;
  string local_d48;
  byte local_d22;
  allocator<char> local_d21;
  AlphaNum local_d20;
  AlphaNum local_cf0;
  string local_cc0;
  allocator<char> local_c99;
  string local_c98;
  Sub local_c78;
  allocator<char> local_bb9;
  string local_bb8;
  AlphaNum local_b98;
  AlphaNum local_b68;
  byte local_b32;
  allocator<char> local_b31;
  string local_b30;
  allocator<char> local_b09;
  string local_b08;
  AlphaNum local_ae8;
  AlphaNum local_ab8;
  string local_a88;
  allocator<char> local_a61;
  string local_a60;
  string local_a40;
  allocator<char> local_a19;
  string local_a18;
  string local_9f8;
  allocator<char> local_9d1;
  string local_9d0;
  basic_string_view<char,_std::char_traits<char>_> local_9b0;
  size_type local_9a0;
  allocator<char> local_991;
  string local_990;
  string local_970;
  allocator<char> local_949;
  string local_948;
  Sub *local_928;
  Sub local_920;
  Sub local_868;
  Sub local_7b0;
  Sub local_6f8;
  Sub local_640;
  Sub local_588;
  Sub local_4d0;
  Sub local_418;
  Sub local_360;
  iterator local_2a8;
  size_type local_2a0;
  undefined1 local_291;
  undefined1 auStack_290 [7];
  bool bytes;
  undefined1 local_288 [16];
  undefined1 local_278 [6];
  bool empty_default;
  AlphaNum local_258;
  AlphaNum local_228;
  byte local_1f1;
  string local_1f0;
  AlphaNum local_1d0;
  byte local_199;
  string local_198;
  AlphaNum local_178;
  AlphaNum local_148;
  undefined1 local_118 [8];
  string lazy_var;
  AlphaNum local_88;
  byte local_42;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string trivial_default;
  Options *opts_local;
  FieldDescriptor *field_local;
  
  local_42 = 0;
  trivial_default.field_2._8_8_ = opts;
  if ((opts->experimental_use_micro_string & 1U) == 0) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_88,"::");
    sVar2 = ProtobufNamespace((Options *)trivial_default.field_2._8_8_);
    absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&stack0xffffffffffffff48,sVar2);
    absl::lts_20250127::AlphaNum::AlphaNum
              ((AlphaNum *)((long)&lazy_var.field_2 + 8),"::internal::GetEmptyStringAlreadyInited()"
              );
    in_RCX = (Options *)((long)&lazy_var.field_2 + 8);
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_40,(lts_20250127 *)&local_88,(AlphaNum *)&stack0xffffffffffffff48,
               (AlphaNum *)in_RCX,in_R8);
  }
  else {
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_40,"::absl::string_view()",&local_41);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator(&local_41);
  }
  local_199 = 0;
  local_1f1 = 0;
  local_288[0xf] = 0;
  if ((*(byte *)(trivial_default.field_2._8_8_ + 0xd0) & 1) == 0) {
    this = FieldDescriptor::containing_type(field);
    QualifiedClassName_abi_cxx11_
              (&local_1f0,(cpp *)this,(Descriptor *)trivial_default.field_2._8_8_,in_RCX);
    local_1f1 = 1;
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_1d0,&local_1f0);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_228,"::");
    MakeDefaultFieldName_abi_cxx11_((string *)local_278,(cpp *)field,field_02);
    local_288[0xf] = 1;
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_258,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_118,(lts_20250127 *)&local_1d0,&local_228,&local_258,in_R8);
  }
  else {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_148,"Impl_::");
    MakeDefaultFieldName_abi_cxx11_(&local_198,(cpp *)field,field_01);
    local_199 = 1;
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_178,&local_198);
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_118,(lts_20250127 *)&local_148,&local_178,(AlphaNum *)in_RCX);
  }
  if ((local_288[0xf] & 1) != 0) {
    std::__cxx11::string::~string((string *)local_278);
  }
  if ((local_1f1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  if ((local_199 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_198);
  }
  sVar2 = FieldDescriptor::default_value_string(field);
  local_288._0_8_ = sVar2._M_str;
  field_00 = (FieldDescriptor *)sVar2._M_len;
  _auStack_290 = field_00;
  local_288[0xe] =
       std::basic_string_view<char,_std::char_traits<char>_>::empty
                 ((basic_string_view<char,_std::char_traits<char>_> *)auStack_290);
  TVar1 = FieldDescriptor::type(field);
  local_291 = TVar1 == TYPE_BYTES;
  local_d72 = 1;
  local_928 = &local_920;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"kDefault",&local_949);
  DefaultValue_abi_cxx11_(&local_970,(cpp *)trivial_default.field_2._8_8_,(Options *)field,field_00)
  ;
  protobuf::io::Printer::Sub::Sub<std::__cxx11::string>(&local_920,&local_948,&local_970);
  local_928 = &local_868;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_990,"kDefaultLen",&local_991);
  sVar2 = FieldDescriptor::default_value_string(field);
  local_9b0._M_str = sVar2._M_str;
  b = (AlphaNum *)sVar2._M_len;
  local_9b0._M_len = (size_t)b;
  local_9a0 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_9b0);
  protobuf::io::Printer::Sub::Sub<unsigned_long>(&local_868,&local_990,&local_9a0);
  local_928 = &local_7b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9d0,"default_variable_name",&local_9d1);
  MakeDefaultName_abi_cxx11_(&local_9f8,(cpp *)field,field_03);
  protobuf::io::Printer::Sub::Sub<std::__cxx11::string>(&local_7b0,&local_9d0,&local_9f8);
  local_928 = &local_6f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a18,"default_variable_field",&local_a19);
  MakeDefaultFieldName_abi_cxx11_(&local_a40,(cpp *)field,field_04);
  protobuf::io::Printer::Sub::Sub<std::__cxx11::string>(&local_6f8,&local_a18,&local_a40);
  local_928 = &local_640;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a60,"kDefaultStr",&local_a61);
  if ((local_288[0xe] & 1) == 0) {
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_ab8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_ae8,".get()");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_a88,(lts_20250127 *)&local_ab8,&local_ae8,b);
  }
  else {
    std::__cxx11::string::string((string *)&local_a88,(string *)local_40);
  }
  protobuf::io::Printer::Sub::Sub<std::__cxx11::string>(&local_640,&local_a60,&local_a88);
  local_928 = &local_588;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b08,"kDefaultValue",&local_b09);
  local_b32 = 0;
  if ((local_288[0xe] & 1) == 0) {
    std::allocator<char>::allocator();
    local_b32 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b30,"nullptr",&local_b31);
  }
  else {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_b68,"&");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_b98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_b30,(lts_20250127 *)&local_b68,&local_b98,b);
  }
  protobuf::io::Printer::Sub::Sub<std::__cxx11::string>(&local_588,&local_b08,&local_b30);
  local_928 = &local_4d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_bb8,"lazy_var",&local_bb9);
  protobuf::io::Printer::Sub::Sub<std::__cxx11::string&>
            (&local_4d0,&local_bb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
  local_928 = &local_418;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c98,"lazy_args",&local_c99);
  local_d22 = 0;
  if ((local_288[0xe] & 1) == 0) {
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_cf0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_d20,",");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_cc0,(lts_20250127 *)&local_cf0,&local_d20,b);
  }
  else {
    std::allocator<char>::allocator();
    local_d22 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cc0,anon_var_dwarf_37cdd0 + 5,&local_d21);
  }
  protobuf::io::Printer::Sub::Sub<std::__cxx11::string>(&local_c78,&local_c98,&local_cc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d48,",",&local_d49);
  protobuf::io::Printer::Sub::WithSuffix(&local_418,&local_c78,&local_d48);
  local_928 = &local_360;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d70,"byte",&local_d71);
  if ((local_291 & 1) == 0) {
    local_e78 = (char (*) [5])0x212f6bd;
  }
  else {
    local_e78 = (char (*) [5])0x1f68bc2;
  }
  protobuf::io::Printer::Sub::Sub<char_const(&)[5]>(&local_360,&local_d70,local_e78);
  local_d72 = 0;
  local_2a8 = &local_920;
  local_2a0 = 9;
  std::allocator<google::protobuf::io::Printer::Sub>::allocator(&local_d73);
  __l._M_len = local_2a0;
  __l._M_array = local_2a8;
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  vector(__return_storage_ptr__,__l,&local_d73);
  std::allocator<google::protobuf::io::Printer::Sub>::~allocator(&local_d73);
  local_e88 = (Sub *)&local_2a8;
  do {
    local_e88 = local_e88 + -1;
    protobuf::io::Printer::Sub::~Sub(local_e88);
  } while (local_e88 != &local_920);
  std::__cxx11::string::~string((string *)&local_d70);
  std::allocator<char>::~allocator(&local_d71);
  std::__cxx11::string::~string((string *)&local_d48);
  std::allocator<char>::~allocator(&local_d49);
  protobuf::io::Printer::Sub::~Sub(&local_c78);
  std::__cxx11::string::~string((string *)&local_cc0);
  if ((local_d22 & 1) != 0) {
    std::allocator<char>::~allocator(&local_d21);
  }
  std::__cxx11::string::~string((string *)&local_c98);
  std::allocator<char>::~allocator(&local_c99);
  std::__cxx11::string::~string((string *)&local_bb8);
  std::allocator<char>::~allocator(&local_bb9);
  std::__cxx11::string::~string((string *)&local_b30);
  if ((local_b32 & 1) != 0) {
    std::allocator<char>::~allocator(&local_b31);
  }
  std::__cxx11::string::~string((string *)&local_b08);
  std::allocator<char>::~allocator(&local_b09);
  std::__cxx11::string::~string((string *)&local_a88);
  std::__cxx11::string::~string((string *)&local_a60);
  std::allocator<char>::~allocator(&local_a61);
  std::__cxx11::string::~string((string *)&local_a40);
  std::__cxx11::string::~string((string *)&local_a18);
  std::allocator<char>::~allocator(&local_a19);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::allocator<char>::~allocator(&local_9d1);
  std::__cxx11::string::~string((string *)&local_990);
  std::allocator<char>::~allocator(&local_991);
  std::__cxx11::string::~string((string *)&local_970);
  std::__cxx11::string::~string((string *)&local_948);
  std::allocator<char>::~allocator(&local_949);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sub> Vars(const FieldDescriptor* field, const Options& opts) {
  auto trivial_default =
      opts.experimental_use_micro_string
          ? "::absl::string_view()"
          : absl::StrCat("::", ProtobufNamespace(opts),
                         "::internal::GetEmptyStringAlreadyInited()");
  auto lazy_var =
      opts.experimental_use_micro_string
          ? absl::StrCat("Impl_::", MakeDefaultFieldName(field))
          : absl::StrCat(QualifiedClassName(field->containing_type(), opts),
                         "::", MakeDefaultFieldName(field));

  bool empty_default = field->default_value_string().empty();
  bool bytes = field->type() == FieldDescriptor::TYPE_BYTES;

  return {
      {"kDefault", DefaultValue(opts, field)},
      {"kDefaultLen", field->default_value_string().size()},
      {"default_variable_name", MakeDefaultName(field)},
      {"default_variable_field", MakeDefaultFieldName(field)},

      {"kDefaultStr",
       !empty_default ? absl::StrCat(lazy_var, ".get()") : trivial_default},
      {"kDefaultValue",
       !empty_default ? "nullptr" : absl::StrCat("&", trivial_default)},

      {"lazy_var", lazy_var},
      Sub{"lazy_args", !empty_default ? absl::StrCat(lazy_var, ",") : ""}
          .WithSuffix(","),

      {"byte", bytes ? "void" : "char"},
  };
}